

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void fixstr(char *p)

{
  byte bVar1;
  
  if (p == (char *)0x0) {
    return;
  }
  do {
    bVar1 = *p;
    if (bVar1 < 0x54) {
      if (bVar1 == 0x4e) {
        bVar1 = 10;
        goto LAB_0010407c;
      }
      if (bVar1 == 0x53) {
        bVar1 = 0x20;
        goto LAB_0010407c;
      }
      if (bVar1 == 0) {
        return;
      }
    }
    else {
      if (bVar1 == 0x5a) {
        bVar1 = 0;
      }
      else {
        if (bVar1 != 0x54) goto LAB_0010407e;
        bVar1 = 9;
      }
LAB_0010407c:
      *p = bVar1;
    }
LAB_0010407e:
    p = (char *)((byte *)p + 1);
  } while( true );
}

Assistant:

void
fixstr(p)
register char *p;
{
	if (p == NULL)
		return;

	for (; *p != '\0'; p++)
		if (*p == 'N')
			*p = '\n';
		else if (*p == 'T')
			*p = '\t';
		else if (*p == 'S')
			*p = ' ';
		else if (*p == 'Z')
			*p = '\0';
}